

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O3

void missum(monst *mdef,attack *mattk)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  obj *poVar5;
  char *line;
  
  iVar3 = could_seduce(&youmonst,mdef,mattk);
  if (iVar3 == 0) {
    if (mdef->wormno == '\0') {
      if ((viz_array[mdef->my][mdef->mx] & 2U) == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027a86c;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027a863;
        }
        else {
LAB_0027a863:
          if (ublindf == (obj *)0x0) goto LAB_0027a907;
LAB_0027a86c:
          if (ublindf->oartifact != '\x1d') goto LAB_0027a907;
        }
        if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
             (((youmonst.data)->mflags3 & 0x100) == 0)) ||
            ((viz_array[mdef->my][mdef->mx] & 1U) == 0)) || ((mdef->data->mflags3 & 0x200) == 0))
        goto LAB_0027a907;
      }
LAB_0027a8b9:
      uVar1 = *(uint *)&mdef->field_0x60;
      if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_0027a8fa;
        goto LAB_0027a907;
      }
      if ((uVar1 & 0x280) != 0) goto LAB_0027a907;
LAB_0027a8fa:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_0027a907;
LAB_0027aa47:
      if (flags.verbose != '\0') {
        pcVar4 = mon_nam(mdef);
        line = "You miss %s.";
        goto LAB_0027aa63;
      }
    }
    else {
      bVar2 = worm_known(level,mdef);
      if (bVar2 != '\0') goto LAB_0027a8b9;
LAB_0027a907:
      if (((mdef->data->mflags1 & 0x10000) == 0) &&
         ((poVar5 = which_armor(mdef,4), poVar5 == (obj *)0x0 ||
          (poVar5 = which_armor(mdef,4), poVar5->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027a95f;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027a95a;
        }
        else {
LAB_0027a95a:
          if (ublindf != (obj *)0x0) {
LAB_0027a95f:
            if (ublindf->oartifact == '\x1d') goto LAB_0027a9e0;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0027aa47;
        }
LAB_0027a9e0:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar3 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
        goto LAB_0027aa47;
      }
      if ((u.uprops[0x42].intrinsic != 0) ||
         ((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(mdef), bVar2 != '\0'))))
      goto LAB_0027aa47;
    }
    pline("You miss it.");
  }
  else {
    pcVar4 = mon_nam(mdef);
    line = "You pretend to be friendly to %s.";
LAB_0027aa63:
    pline(line,pcVar4);
  }
  if ((*(uint *)&mdef->field_0x60 & 0xc0000) != 0x40000) {
    return;
  }
  wakeup(mdef);
  return;
}

Assistant:

void missum(struct monst *mdef, const struct attack *mattk)
{
	if (could_seduce(&youmonst, mdef, mattk))
		pline("You pretend to be friendly to %s.", mon_nam(mdef));
	else if (canspotmon(level, mdef) && flags.verbose)
		pline("You miss %s.", mon_nam(mdef));
	else
		pline("You miss it.");
	if (!mdef->msleeping && mdef->mcanmove)
		wakeup(mdef);
}